

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_array_copy
          (CompilerGLSL *this,string *lhs,uint32_t rhs_id,StorageClass param_3,StorageClass param_4)

{
  string local_38;
  
  to_expression_abi_cxx11_(&local_38,this,rhs_id,true);
  statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
            (this,lhs,(char (*) [4])0x2f38c7,&local_38,(char (*) [2])0x2d9bde);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_array_copy(const string &lhs, uint32_t rhs_id, StorageClass, StorageClass)
{
	statement(lhs, " = ", to_expression(rhs_id), ";");
}